

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O1

void __thiscall
cfd::core::KeyData::KeyData
          (KeyData *this,Pubkey *pubkey,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *child_num_list,ByteData *finterprint)

{
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)pubkey);
  Privkey::Privkey(&this->privkey_);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->path_,child_num_list);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->fingerprint_,
             &finterprint->data_);
  return;
}

Assistant:

KeyData::KeyData(
    const Pubkey& pubkey, const std::vector<uint32_t>& child_num_list,
    const ByteData& finterprint)
    : pubkey_(pubkey), path_(child_num_list), fingerprint_(finterprint) {
  // do nothing
}